

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelInstance.cpp
# Opt level: O3

void __thiscall ModelInstance::transition(ModelInstance *this,float x)

{
  iterator iVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  float fVar7;
  float local_c0 [36];
  
  uVar3 = this->state;
  uVar4 = (ulong)(int)uVar3;
  if (0x23 < uVar4) {
    std::__throw_out_of_range_fmt("array::at: __n (which is %zu) >= _Nm (which is %zu)",uVar4,0x24);
  }
  fVar7 = 0.0;
  lVar2 = -0x90;
  do {
    fVar7 = fVar7 + *(float *)((long)(this->network).transitions._M_elems[uVar4 + 1]._M_elems +
                              lVar2);
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0);
  if ((fVar7 != 0.0) || (NAN(fVar7))) {
    lVar2 = 0;
    memset(local_c0 + 1,0,0x8c);
    fVar7 = (this->network).transitions._M_elems[uVar4]._M_elems[0];
    local_c0[0] = fVar7;
    do {
      fVar7 = fVar7 + *(float *)((long)(this->network).transitions._M_elems[uVar4]._M_elems +
                                lVar2 + 4);
      *(float *)((long)local_c0 + lVar2 + 4U) = fVar7;
      lVar2 = lVar2 + 4;
    } while (lVar2 != 0x8c);
    lVar2 = 0x90;
    lVar6 = 0;
    do {
      if (x < local_c0[lVar6]) {
        uVar5 = (uint)lVar6;
        if ((uVar3 - 6 < 6) && (uVar3 + 6 == uVar5)) {
          return;
        }
        if (uVar5 == uVar3 + 1 && uVar3 % 6 == 1) {
          return;
        }
        if ((1 < uVar3 % 6) && ((uVar3 / 6) * 6 == uVar5)) {
          iVar1._M_current =
               (this->dimersactive)._M_elems[0].super__Vector_base<float,_std::allocator<float>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar1._M_current ==
              (this->dimersactive)._M_elems[0].super__Vector_base<float,_std::allocator<float>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                      ((vector<float,std::allocator<float>> *)&this->dimersactive,iVar1,
                       &this->currenttime);
            uVar3 = this->state;
          }
          else {
            *iVar1._M_current = this->currenttime;
            (this->dimersactive)._M_elems[0].super__Vector_base<float,_std::allocator<float>_>.
            _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
          }
        }
        if ((0xb < (int)uVar3) && (uVar3 % 6 == uVar5)) {
          iVar1._M_current =
               (this->dimersactive)._M_elems[1].super__Vector_base<float,_std::allocator<float>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar1._M_current ==
              (this->dimersactive)._M_elems[1].super__Vector_base<float,_std::allocator<float>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                      ((vector<float,std::allocator<float>> *)((this->dimersactive)._M_elems + 1),
                       iVar1,&this->currenttime);
          }
          else {
            *iVar1._M_current = this->currenttime;
            (this->dimersactive)._M_elems[1].super__Vector_base<float,_std::allocator<float>_>.
            _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
          }
        }
        this->state = uVar5;
        updateStep(this);
        return;
      }
      lVar6 = lVar6 + 1;
      lVar2 = lVar2 + -4;
    } while (lVar2 != 0);
  }
  return;
}

Assistant:

void ModelInstance::transition(float x) {
	// No outgoing edges, then stay in this state
	if (std::accumulate(network.transitions.at(state).begin(), network.transitions.at(state).end(), 0.0) == 0){
		return;
	}

	// Iterate over outgoing edges, find the one to take depending on the random number x
	std::array<float, 36> cumulative{};
	std::partial_sum(network.transitions.at(state).begin(), network.transitions.at(state).end(), cumulative.begin());
	int index = 0;
	for (float threshold : cumulative){
		if (x < threshold){
			//It is not one of transitions where S is activated
			bool activatingS = (state / 6 == 1 && index == state + 6) ||
							   (state % 6 == 1 && index == state + 1);
			if (!activatingS){
				if (state % 6 >= 2 && index == state - (state % 6)) {
					dimersactive.at(0).push_back(currenttime);
					//std::cout << "inactivate complex 1" << std::endl;
				}
				if (state / 6 >= 2 && index == state % 6) {
					dimersactive.at(1).push_back(currenttime);
					//std::cout << "inactivate complex 2" << std::endl;
				}
				// if not adding Si, position does not matter, else make sure it is close enough or do nothing
				state = index;
				updateStep();
			}
			break;
		}
		index++;
	}
}